

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StandardColumnData::GetUpdateStatistics(StandardColumnData *this)

{
  undefined8 __p;
  pointer this_00;
  type other;
  long in_RSI;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> stats;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
  validity_stats;
  undefined1 local_98 [16];
  undefined1 local_88 [120];
  
  if (*(long *)(in_RSI + 0xc0) == 0) {
    local_98._0_8_ =
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         0x0;
  }
  else {
    unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>::operator->
              ((unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>
                *)(in_RSI + 0xc0));
    UpdateSegment::GetStatistics((UpdateSegment *)local_98);
  }
  ColumnData::GetUpdateStatistics((ColumnData *)(local_98 + 8));
  if ((_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
      local_98._0_8_ == (BaseStatistics *)0x0) {
    if ((element_type *)local_98._8_8_ == (element_type *)0x0) {
      (this->super_ColumnData)._vptr_ColumnData = (_func_int **)0x0;
      goto LAB_01aa2ac3;
    }
    LogicalType::LogicalType((LogicalType *)(local_88 + 8),(LogicalType *)(in_RSI + 0x30));
    BaseStatistics::CreateEmpty((BaseStatistics *)(local_88 + 0x20),(LogicalType *)(local_88 + 8));
    BaseStatistics::ToUnique((BaseStatistics *)local_88);
    __p = local_88._0_8_;
    local_88._0_8_ = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
    reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
          local_98,(pointer)__p);
    ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
    ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
                local_88);
    BaseStatistics::~BaseStatistics((BaseStatistics *)(local_88 + 0x20));
    LogicalType::~LogicalType((LogicalType *)(local_88 + 8));
  }
  if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
    this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                            *)local_98);
    other = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
            operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                       *)(local_98 + 8));
    BaseStatistics::Merge(this_00,other);
  }
  (this->super_ColumnData)._vptr_ColumnData = (_func_int **)local_98._0_8_;
  local_98._0_8_ =
       (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)0x0
  ;
LAB_01aa2ac3:
  ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
              (local_98 + 8));
  ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
              local_98);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> StandardColumnData::GetUpdateStatistics() {
	auto stats = updates ? updates->GetStatistics() : nullptr;
	auto validity_stats = validity.GetUpdateStatistics();
	if (!stats && !validity_stats) {
		return nullptr;
	}
	if (!stats) {
		stats = BaseStatistics::CreateEmpty(type).ToUnique();
	}
	if (validity_stats) {
		stats->Merge(*validity_stats);
	}
	return stats;
}